

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cc
# Opt level: O0

bool __thiscall
FIX::double_conversion::DoubleToStringConverter::ToExponential
          (DoubleToStringConverter *this,double value,int requested_digits,
          StringBuilder *result_builder)

{
  bool bVar1;
  int exponent;
  int iStack_cc;
  bool unique_zero;
  int i;
  int decimal_rep_length;
  char decimal_rep [122];
  bool local_3d;
  int kDecimalRepCapacity;
  bool sign;
  int decimal_point;
  StringBuilder *local_30;
  StringBuilder *result_builder_local;
  double dStack_20;
  int requested_digits_local;
  double value_local;
  DoubleToStringConverter *this_local;
  
  local_30 = result_builder;
  result_builder_local._4_4_ = requested_digits;
  dStack_20 = value;
  value_local = (double)this;
  Double::Double((Double *)&stack0xffffffffffffffc8,value);
  bVar1 = Double::IsSpecial((Double *)&stack0xffffffffffffffc8);
  if (bVar1) {
    this_local._7_1_ = HandleSpecialValues(this,dStack_20,local_30);
  }
  else if (result_builder_local._4_4_ < -1) {
    this_local._7_1_ = false;
  }
  else if (result_builder_local._4_4_ < 0x79) {
    if (result_builder_local._4_4_ == -1) {
      DoubleToAscii(dStack_20,SHORTEST,0,(char *)&i,0x7a,&local_3d,&stack0xffffffffffffff34,
                    &kDecimalRepCapacity);
    }
    else {
      DoubleToAscii(dStack_20,PRECISION,result_builder_local._4_4_ + 1,(char *)&i,0x7a,&local_3d,
                    &stack0xffffffffffffff34,&kDecimalRepCapacity);
      if (result_builder_local._4_4_ + 1 < iStack_cc) {
        __assert_fail("decimal_rep_length <= requested_digits + 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                      ,0x106,
                      "bool FIX::double_conversion::DoubleToStringConverter::ToExponential(double, int, StringBuilder *) const"
                     );
      }
      for (exponent = iStack_cc; exponent < result_builder_local._4_4_ + 1; exponent = exponent + 1)
      {
        *(undefined1 *)((long)&i + (long)exponent) = 0x30;
      }
      iStack_cc = result_builder_local._4_4_ + 1;
    }
    if (((local_3d & 1U) != 0) &&
       (((dStack_20 != 0.0 || (NAN(dStack_20))) || ((this->flags_ & 8U) == 0)))) {
      StringBuilder::AddCharacter(local_30,'-');
    }
    CreateExponentialRepresentation(this,(char *)&i,iStack_cc,kDecimalRepCapacity + -1,local_30);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DoubleToStringConverter::ToExponential(
    double value,
    int requested_digits,
    StringBuilder* result_builder) const {
  if (Double(value).IsSpecial()) {
    return HandleSpecialValues(value, result_builder);
  }

  if (requested_digits < -1) return false;
  if (requested_digits > kMaxExponentialDigits) return false;

  int decimal_point;
  bool sign;
  // Add space for digit before the decimal point and the '\0' character.
  const int kDecimalRepCapacity = kMaxExponentialDigits + 2;
  ASSERT(kDecimalRepCapacity > kBase10MaximalLength);
  char decimal_rep[kDecimalRepCapacity];
  int decimal_rep_length;

  if (requested_digits == -1) {
    DoubleToAscii(value, SHORTEST, 0,
                  decimal_rep, kDecimalRepCapacity,
                  &sign, &decimal_rep_length, &decimal_point);
  } else {
    DoubleToAscii(value, PRECISION, requested_digits + 1,
                  decimal_rep, kDecimalRepCapacity,
                  &sign, &decimal_rep_length, &decimal_point);
    ASSERT(decimal_rep_length <= requested_digits + 1);

    for (int i = decimal_rep_length; i < requested_digits + 1; ++i) {
      decimal_rep[i] = '0';
    }
    decimal_rep_length = requested_digits + 1;
  }

  bool unique_zero = ((flags_ & UNIQUE_ZERO) != 0);
  if (sign && (value != 0.0 || !unique_zero)) {
    result_builder->AddCharacter('-');
  }

  int exponent = decimal_point - 1;
  CreateExponentialRepresentation(decimal_rep,
                                  decimal_rep_length,
                                  exponent,
                                  result_builder);
  return true;
}